

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_index_type.h
# Opt level: O2

bool draco::ComputeParallelogramPrediction<draco::CornerTable,int>
               (int data_entry_id,CornerIndex ci,CornerTable *table,
               vector<int,_std::allocator<int>_> *vertex_to_data_map,int *in_data,int num_components
               ,int *out_prediction)

{
  CornerIndex ci_00;
  ulong uVar1;
  ulong uVar2;
  int vert_next;
  int vert_opp;
  int local_2c;
  int local_28;
  int local_24;
  
  if (ci.value_ == 0xffffffff) {
    return false;
  }
  ci_00.value_ = (table->opposite_corners_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[ci.value_].value_;
  if (ci_00.value_ != 0xffffffff) {
    GetParallelogramEntries<draco::CornerTable>
              (ci_00,table,vertex_to_data_map,&local_24,&local_28,&local_2c);
    if ((local_24 < data_entry_id) && (local_28 < data_entry_id)) {
      uVar1 = 0;
      if (local_2c < data_entry_id) {
        uVar2 = (ulong)(uint)num_components;
        if (num_components < 1) {
          uVar2 = uVar1;
        }
        for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          out_prediction[uVar1] =
               (in_data[(long)(local_2c * num_components) + uVar1] +
               in_data[(long)(local_28 * num_components) + uVar1]) -
               in_data[(long)(local_24 * num_components) + uVar1];
        }
        uVar1 = 1;
      }
      goto LAB_00155af8;
    }
  }
  uVar1 = 0;
LAB_00155af8:
  return SUB81(uVar1,0);
}

Assistant:

constexpr bool operator==(const IndexType &i) const {
    return value_ == i.value_;
  }